

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O2

void SHMCleanup(void)

{
  uint __errnum;
  Volatile<void_*> VVar1;
  FILE *pFVar2;
  int iVar3;
  long lVar4;
  uint *puVar5;
  char *pcVar6;
  
  if (PAL_InitializeChakraCoreCalled) {
    SHMLock();
    SHMRelease();
    if (*(DWORD *)((long)shm_segment_bases[0].m_val + 0x40) == gPID) {
      fprintf(_stderr,"] %s %s:%d","SHMCleanup",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,0x206);
      pFVar2 = _stderr;
      VVar1 = locking_thread;
      lVar4 = syscall(0xba);
      fprintf(pFVar2,
              "Expression: header->spinlock != my_pid, Description: SHMCleanup called while the current process still owns the lock [owner thread=%u, current thread: %u]\n"
              ,VVar1.m_val,lVar4);
    }
    while (shm_numsegments != 0) {
      shm_numsegments = shm_numsegments + -1;
      iVar3 = munmap(shm_segment_bases[shm_numsegments].m_val,0x40000);
      if (iVar3 == -1) {
        fprintf(_stderr,"] %s %s:%d","SHMCleanup",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
                ,0x210);
        pFVar2 = _stderr;
        puVar5 = (uint *)__errno_location();
        __errnum = *puVar5;
        pcVar6 = strerror(__errnum);
        fprintf(pFVar2,"munmap() failed; errno is %d (%s).\n",(ulong)__errnum,pcVar6);
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

void SHMCleanup(void)
{
    SHM_FIRST_HEADER *header;
    pid_t my_pid;

    TRACE("Starting shared memory cleanup\n");

    SHMLock();
    SHMRelease();

    /* We should not be holding the spinlock at this point. If we are, release
       the spinlock. by setting it to 0 */
    my_pid = gPID;
    header = (SHM_FIRST_HEADER *)shm_segment_bases[0].Load();

    _ASSERT_MSG(header->spinlock != my_pid,
            "SHMCleanup called while the current process still owns the lock "
            "[owner thread=%u, current thread: %u]\n",
            locking_thread.Load(), THREADSilentGetCurrentThreadId());

    /* Unmap memory segments */
    while(shm_numsegments)
    {
        shm_numsegments--;
        if ( -1 == munmap( shm_segment_bases[ shm_numsegments ],
                           segment_size ) )
        {
            ASSERT( "munmap() failed; errno is %d (%s).\n",
                  errno, strerror( errno ) );
        }
    }

    save_waste();
    TRACE("SHMCleanup complete!\n");
}